

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCentroidWeight
          (VClient *this,string *i_rCameraName,uint i_CentroidIndex,double *o_rWeight)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  VCentroidWeights *pVVar4;
  size_type sVar5;
  const_reference pvVar6;
  VCentroidWeights *pCentroidWeightSet;
  VCameraInfo *pCamera;
  Enum local_44;
  undefined1 local_40 [4];
  Enum GetResult;
  scoped_lock Lock;
  double *o_rWeight_local;
  uint i_CentroidIndex_local;
  string *i_rCameraName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rWeight;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40,&this->m_FrameMutex);
  local_44 = Success;
  bVar2 = InitGet<double>(this,&local_44,(double *)Lock._8_8_);
  if (((bVar2) && (pVVar3 = GetCamera(this,i_rCameraName,&local_44), pVVar3 != (VCameraInfo *)0x0))
     && (pVVar4 = GetCentroidWeightSet(this,pVVar3->m_CameraID,&local_44),
        pVVar4 != (VCentroidWeights *)0x0)) {
    sVar5 = std::vector<float,_std::allocator<float>_>::size(&pVVar4->m_Weights);
    if (i_CentroidIndex < sVar5) {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&pVVar4->m_Weights,(ulong)i_CentroidIndex);
      *(double *)Lock._8_8_ = (double)*pvVar6;
    }
    else {
      local_44 = InvalidIndex;
    }
  }
  EVar1 = local_44;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_40);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCentroidWeight( const std::string & i_rCameraName,
  const unsigned int i_CentroidIndex,
  double & o_rWeight ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rWeight ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    const ViconCGStream::VCentroidWeights* pCentroidWeightSet = GetCentroidWeightSet( pCamera->m_CameraID, GetResult );
    if( pCentroidWeightSet )
    {
      if( i_CentroidIndex < pCentroidWeightSet->m_Weights.size() )
      {
        o_rWeight = pCentroidWeightSet->m_Weights[i_CentroidIndex];;
      }
      else
      {
        GetResult = Result::InvalidIndex;
      }
    }
  }
  return GetResult;
}